

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O2

void dump_ports_cb(Port *p,char *name,char *param_3,Ports *param_4,void *v,void *param_6)

{
  MetaContainer MVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  char *pcVar5;
  char *pcVar6;
  ostream *poVar7;
  char cVar8;
  char *pcVar9;
  Port *pPVar10;
  MetaContainer *this;
  MetaContainer *this_00;
  MetaContainer *this_01;
  MetaContainer *this_02;
  string *this_03;
  MetaContainer *this_04;
  MetaContainer *this_05;
  MetaContainer *this_06;
  bool bVar11;
  MetaIterator MVar12;
  MetaIterator MVar13;
  MetaIterator MVar14;
  MetaContainer meta;
  allocator<char> local_189;
  char *meta_00;
  char *name_local;
  string local_170;
  string local_150 [32];
  string doc;
  undefined1 local_f0 [32];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70 [32];
  string local_50;
  
  this = &meta;
  this_00 = &meta;
  this_01 = &meta;
  this_02 = &meta;
  this_04 = &meta;
  this_05 = &meta;
  this_06 = &meta;
  name_local = name;
  if ((dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
       already_dumped_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                                   ::already_dumped_abi_cxx11_), iVar3 != 0)) {
    dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
    already_dumped_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
    already_dumped_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
    already_dumped_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
          ::already_dumped_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
    already_dumped_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
          ::already_dumped_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
    already_dumped_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(std::
                 set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::~set,&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                         ::already_dumped_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                         ::already_dumped_abi_cxx11_);
  }
  pcVar9 = name_local;
  local_170._M_string_length = (size_type)p->name;
  local_170._M_dataplus._M_p = name_local;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&doc,(pair<const_char_*,_const_char_*> *)&local_170);
  iVar4 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                  ::already_dumped_abi_cxx11_._M_t,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&doc);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&doc);
  if ((_Rb_tree_header *)iVar4._M_node !=
      &dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)::
       already_dumped_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  meta = rtosc::Port::meta(p);
  pcVar5 = strchr(p->name,0x3a);
  MVar12 = rtosc::Port::MetaContainer::find(&meta,"parameter");
  MVar13 = rtosc::Port::MetaContainer::find(&meta,"documentation");
  pcVar6 = MVar13.title;
  doc._M_dataplus._M_p = (pointer)&doc.field_2;
  doc._M_string_length = 0;
  doc.field_2._M_local_buf[0] = '\0';
  pPVar10 = p;
  rtosc::Port::meta(p);
  MVar13 = rtosc::Port::MetaContainer::end((MetaContainer *)pPVar10);
  if (pcVar6 != MVar13.title) {
    std::__cxx11::string::assign((char *)&doc);
  }
  MVar13 = rtosc::Port::MetaContainer::find(&meta,"internal");
  MVar14 = rtosc::Port::MetaContainer::end(this);
  if (MVar13.title != MVar14.title) {
    std::__cxx11::string::append((char *)&doc);
  }
  pPVar10 = p;
  rtosc::Port::meta(p);
  MVar13 = rtosc::Port::MetaContainer::end((MetaContainer *)pPVar10);
  if (MVar12.title == MVar13.title) {
    MVar12 = rtosc::Port::MetaContainer::end((MetaContainer *)pPVar10);
    if (pcVar6 == MVar12.title) {
LAB_00106a48:
      MVar12 = rtosc::Port::MetaContainer::end((MetaContainer *)pPVar10);
      if ((pcVar5 == (char *)0x0) || (pcVar6 == MVar12.title)) {
        MVar12 = rtosc::Port::MetaContainer::end((MetaContainer *)pPVar10);
        if (pcVar6 == MVar12.title) {
          pcVar6 = "Skipping [UNDOCUMENTED] \"%s\"\n";
          pcVar5 = pcVar9;
        }
        else {
          fprintf(_stderr,"Skipping \"%s\"\n",pcVar9);
          if (pcVar5 == (char *)0x0) goto LAB_001072a7;
          pcVar6 = "    type = %s\n";
        }
        goto LAB_001072a0;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,pcVar9,(allocator<char> *)local_f0);
      std::__cxx11::string::string((string *)&local_b0,(string *)&doc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_f0 + 0x20),pcVar5,&local_189);
      dump_generic_port((ostream *)v,&local_90,&local_b0,(string *)(local_f0 + 0x20));
      std::__cxx11::string::~string((string *)(local_f0 + 0x20));
      std::__cxx11::string::~string((string *)&local_b0);
      this_03 = &local_90;
    }
    else {
      if (pcVar5 != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,"",&local_189);
        pPVar10 = (Port *)local_f0;
        bVar2 = std::operator==(pcVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)pPVar10);
        std::__cxx11::string::~string((string *)pPVar10);
        if (!bVar2) goto LAB_00106a48;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,pcVar9,(allocator<char> *)local_f0);
      std::__cxx11::string::string(local_70,(string *)&doc);
      poVar7 = std::operator<<((ostream *)v," <message_in pattern=\"");
      poVar7 = std::operator<<(poVar7,(string *)&local_50);
      std::operator<<(poVar7,"\" typetag=\"*\">\n");
      poVar7 = std::operator<<((ostream *)v,"  <desc>");
      poVar7 = std::operator<<(poVar7,local_70);
      std::operator<<(poVar7,"</desc>\n");
      std::operator<<((ostream *)v," </message_in>\n");
      std::__cxx11::string::~string(local_70);
      this_03 = &local_50;
    }
LAB_00106ae2:
    std::__cxx11::string::~string((string *)this_03);
    goto LAB_00106f72;
  }
  if (pcVar5 == (char *)0x0) {
LAB_00107278:
    fprintf(_stderr,"rtosc port dumper: Cannot handle \'%s\'\n",pcVar9);
    pcVar6 = "    args = <%s>\n";
LAB_001072a0:
    fprintf(_stderr,pcVar6,pcVar5);
LAB_001072a7:
    std::__cxx11::string::~string((string *)&doc);
    return;
  }
  pcVar6 = strchr(pcVar5,0x66);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = strchr(pcVar5,0x69);
    meta_00 = "";
    if (pcVar6 != (char *)0x0) {
      cVar8 = 'i';
      goto LAB_001068ab;
    }
    pcVar6 = strchr(pcVar5,99);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = strchr(pcVar5,0x54);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = strchr(pcVar5,0x73);
        if (pcVar6 == (char *)0x0) goto LAB_00107278;
        cVar8 = 's';
        goto LAB_001068ab;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,pcVar9,(allocator<char> *)local_f0);
      std::__cxx11::string::string(local_150,(string *)&doc);
      poVar7 = std::operator<<((ostream *)v," <message_in pattern=\"");
      poVar7 = std::operator<<(poVar7,(string *)&local_170);
      std::operator<<(poVar7,"\" typetag=\"T\">\n");
      poVar7 = std::operator<<((ostream *)v,"  <desc>Enable ");
      poVar7 = std::operator<<(poVar7,local_150);
      std::operator<<(poVar7,"</desc>\n");
      std::operator<<((ostream *)v,"  <param_T symbol=\"x\"/>\n");
      std::operator<<((ostream *)v," </message_in>\n");
      poVar7 = std::operator<<((ostream *)v," <message_in pattern=\"");
      poVar7 = std::operator<<(poVar7,(string *)&local_170);
      std::operator<<(poVar7,"\" typetag=\"F\">\n");
      poVar7 = std::operator<<((ostream *)v,"  <desc>Disable ");
      poVar7 = std::operator<<(poVar7,local_150);
      std::operator<<(poVar7,"</desc>\n");
      std::operator<<((ostream *)v,"  <param_F symbol=\"x\"/>\n");
      std::operator<<((ostream *)v," </message_in>\n");
      poVar7 = std::operator<<((ostream *)v," <message_in pattern=\"");
      poVar7 = std::operator<<(poVar7,(string *)&local_170);
      std::operator<<(poVar7,"\" typetag=\"\">\n");
      poVar7 = std::operator<<((ostream *)v,"  <desc>Get state of ");
      poVar7 = std::operator<<(poVar7,local_150);
      std::operator<<(poVar7,"</desc>\n");
      std::operator<<((ostream *)v," </message_in>\n");
      poVar7 = std::operator<<((ostream *)v," <message_out pattern=\"");
      poVar7 = std::operator<<(poVar7,(string *)&local_170);
      std::operator<<(poVar7,"\" typetag=\"T\">\n");
      poVar7 = std::operator<<((ostream *)v,"  <desc>Value of ");
      poVar7 = std::operator<<(poVar7,local_150);
      std::operator<<(poVar7,"</desc>\n");
      std::operator<<((ostream *)v,"  <param_T symbol=\"x\"/>");
      std::operator<<((ostream *)v," </message_out>\n");
      poVar7 = std::operator<<((ostream *)v," <message_out pattern=\"");
      poVar7 = std::operator<<(poVar7,(string *)&local_170);
      std::operator<<(poVar7,"\" typetag=\"F\">\n");
      poVar7 = std::operator<<((ostream *)v,"  <desc>Value of ");
      poVar7 = std::operator<<(poVar7,local_150);
      std::operator<<(poVar7,"</desc>\n");
      std::operator<<((ostream *)v,"  <param_F symbol=\"x\"/>");
      std::operator<<((ostream *)v," </message_out>\n");
      std::__cxx11::string::~string(local_150);
      this_03 = &local_170;
      goto LAB_00106ae2;
    }
    cVar8 = 'c';
    bVar2 = true;
  }
  else {
    cVar8 = 'f';
    meta_00 = "lmin=\"[\" lmax=\"]\"";
LAB_001068ab:
    bVar2 = false;
  }
  poVar7 = std::operator<<((ostream *)v," <message_in pattern=\"");
  poVar7 = std::operator<<(poVar7,pcVar9);
  poVar7 = std::operator<<(poVar7,"\" typetag=\"");
  poVar7 = std::operator<<(poVar7,cVar8);
  std::operator<<(poVar7,"\">\n");
  poVar7 = std::operator<<((ostream *)v,"  <desc>Set Value of ");
  poVar7 = std::operator<<(poVar7,(string *)&doc);
  std::operator<<(poVar7,"</desc>\n");
  MVar12 = rtosc::Port::MetaContainer::find(&meta,"min");
  MVar13 = rtosc::Port::MetaContainer::end(this_00);
  if (MVar12.title == MVar13.title) {
LAB_00106966:
    MVar12 = rtosc::Port::MetaContainer::find(&meta,"enumerated");
    MVar13 = rtosc::Port::MetaContainer::end(this_02);
    if (MVar12.title == MVar13.title) {
      poVar7 = std::operator<<((ostream *)v,"  <param_");
      poVar7 = std::operator<<(poVar7,cVar8);
      std::operator<<(poVar7," symbol=\"x\"");
      pcVar5 = rtosc::Port::MetaContainer::operator[](&meta,"unit");
      units((ostream *)v,pcVar5);
      pcVar5 = "/>\n";
      poVar7 = (ostream *)v;
    }
    else {
      poVar7 = std::operator<<((ostream *)v,"  <param_");
      poVar7 = std::operator<<(poVar7,cVar8);
      std::operator<<(poVar7," symbol=\"x\">\n");
      poVar7 = std::operator<<((ostream *)v,"    <range_min_max min=\"");
      MVar1 = meta;
      iVar3 = enum_min((MetaContainer)meta_00);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar3);
      std::operator<<(poVar7,"\" max=\"");
      iVar3 = enum_max((MetaContainer)meta_00);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)v,iVar3);
      std::operator<<(poVar7,"\">\n");
      add_options((ostream *)v,MVar1);
      std::operator<<((ostream *)v,"    </range_min_max>\n");
      poVar7 = std::operator<<((ostream *)v,"  </param_");
      poVar7 = std::operator<<(poVar7,cVar8);
      pcVar5 = ">\n";
    }
    std::operator<<(poVar7,pcVar5);
  }
  else {
    MVar12 = rtosc::Port::MetaContainer::find(&meta,"max");
    MVar13 = rtosc::Port::MetaContainer::end(this_01);
    bVar11 = MVar12.title != MVar13.title;
    if (!bVar11 || bVar2) {
      bVar2 = (bool)(bVar2 | bVar11);
      goto LAB_00106966;
    }
    poVar7 = std::operator<<((ostream *)v,"  <param_");
    poVar7 = std::operator<<(poVar7,cVar8);
    std::operator<<(poVar7," symbol=\"x\"");
    pcVar5 = rtosc::Port::MetaContainer::operator[](&meta,"unit");
    units((ostream *)v,pcVar5);
    std::operator<<((ostream *)v,">\n");
    poVar7 = std::operator<<((ostream *)v,"   <range_min_max ");
    std::operator<<(poVar7,meta_00);
    poVar7 = std::operator<<((ostream *)v," min=\"");
    pcVar5 = rtosc::Port::MetaContainer::operator[](&meta,"min");
    poVar7 = std::operator<<(poVar7,pcVar5);
    poVar7 = std::operator<<(poVar7,"\"  max=\"");
    pcVar5 = rtosc::Port::MetaContainer::operator[](&meta,"max");
    poVar7 = std::operator<<(poVar7,pcVar5);
    std::operator<<(poVar7,"\"/>\n");
    poVar7 = std::operator<<((ostream *)v,"  </param_");
    poVar7 = std::operator<<(poVar7,cVar8);
    std::operator<<(poVar7,">");
    bVar2 = false;
  }
  std::operator<<((ostream *)v," </message_in>\n");
  poVar7 = std::operator<<((ostream *)v," <message_in pattern=\"");
  poVar7 = std::operator<<(poVar7,pcVar9);
  std::operator<<(poVar7,"\" typetag=\"\">\n");
  poVar7 = std::operator<<((ostream *)v,"  <desc>Get Value of ");
  poVar7 = std::operator<<(poVar7,(string *)&doc);
  std::operator<<(poVar7,"</desc>\n");
  std::operator<<((ostream *)v," </message_in>\n");
  poVar7 = std::operator<<((ostream *)v," <message_out pattern=\"");
  poVar7 = std::operator<<(poVar7,pcVar9);
  poVar7 = std::operator<<(poVar7,"\" typetag=\"");
  poVar7 = std::operator<<(poVar7,cVar8);
  std::operator<<(poVar7,"\">\n");
  poVar7 = std::operator<<((ostream *)v,"  <desc>Value of ");
  poVar7 = std::operator<<(poVar7,(string *)&doc);
  std::operator<<(poVar7,"</desc>\n");
  MVar12 = rtosc::Port::MetaContainer::find(&meta,"min");
  MVar13 = rtosc::Port::MetaContainer::end(this_04);
  if (MVar12.title == MVar13.title) {
LAB_00106d5f:
    MVar12 = rtosc::Port::MetaContainer::find(&meta,"enumerated");
    MVar13 = rtosc::Port::MetaContainer::end(this_06);
    if (MVar12.title != MVar13.title) {
      poVar7 = std::operator<<((ostream *)v,"  <param_");
      poVar7 = std::operator<<(poVar7,cVar8);
      std::operator<<(poVar7," symbol=\"x\">\n");
      poVar7 = std::operator<<((ostream *)v,"    <range_min_max min=\"");
      MVar1 = meta;
      iVar3 = enum_min((MetaContainer)meta_00);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar3);
      std::operator<<(poVar7,"\" max=\"");
      iVar3 = enum_max((MetaContainer)meta_00);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)v,iVar3);
      std::operator<<(poVar7,"\">\n");
      add_options((ostream *)v,MVar1);
      pcVar9 = "    </range_min_max>\n";
      poVar7 = (ostream *)v;
      goto LAB_00106ee8;
    }
    poVar7 = std::operator<<((ostream *)v,"  <param_");
    poVar7 = std::operator<<(poVar7,cVar8);
    std::operator<<(poVar7," symbol=\"x\"");
    pcVar9 = rtosc::Port::MetaContainer::operator[](&meta,"unit");
    units((ostream *)v,pcVar9);
    pcVar9 = "/>\n";
    poVar7 = (ostream *)v;
  }
  else {
    MVar12 = rtosc::Port::MetaContainer::find(&meta,"max");
    MVar13 = rtosc::Port::MetaContainer::end(this_05);
    if (bVar2 || MVar12.title == MVar13.title) goto LAB_00106d5f;
    poVar7 = std::operator<<((ostream *)v,"  <param_");
    poVar7 = std::operator<<(poVar7,cVar8);
    std::operator<<(poVar7," symbol=\"x\"");
    pcVar9 = rtosc::Port::MetaContainer::operator[](&meta,"unit");
    units((ostream *)v,pcVar9);
    std::operator<<((ostream *)v,">\n");
    poVar7 = std::operator<<((ostream *)v,"   <range_min_max ");
    std::operator<<(poVar7,meta_00);
    poVar7 = std::operator<<((ostream *)v," min=\"");
    pcVar9 = rtosc::Port::MetaContainer::operator[](&meta,"min");
    poVar7 = std::operator<<(poVar7,pcVar9);
    poVar7 = std::operator<<(poVar7,"\"  max=\"");
    pcVar9 = rtosc::Port::MetaContainer::operator[](&meta,"max");
    poVar7 = std::operator<<(poVar7,pcVar9);
    pcVar9 = "\"/>\n";
LAB_00106ee8:
    std::operator<<(poVar7,pcVar9);
    poVar7 = std::operator<<((ostream *)v,"  </param_");
    poVar7 = std::operator<<(poVar7,cVar8);
    pcVar9 = ">\n";
  }
  std::operator<<(poVar7,pcVar9);
  std::operator<<((ostream *)v," </message_out>\n");
LAB_00106f72:
  std::__cxx11::string::~string((string *)&doc);
  std::
  _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::_M_emplace_unique<char_const*&,char_const*const&>
            ((_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)&dump_ports_cb(rtosc::Port_const*,char_const*,char_const*,rtosc::Ports_const&,void*,void*)
                 ::already_dumped_abi_cxx11_,&name_local,&p->name);
  return;
}

Assistant:

static void dump_ports_cb(const rtosc::Port *p, const char *name,const char*,
                          const Ports&,void *v, void*)
{
    static std::set<std::pair<std::string, std::string>> already_dumped;
    if(already_dumped.find(std::make_pair(name, p->name)) == already_dumped.end())
    {
        bool dumped = do_dump_ports(p, name, v);
        if(dumped)
            already_dumped.emplace(name, p->name);
    }
}